

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_free_ref(void)

{
  if (fsnav->ref != (fsnav_ref *)0x0) {
    fsnav->ref->cfg = (char *)0x0;
    fsnav->ref->cfglength = 0;
    fsnav_free_sol(&fsnav->ref->sol);
    free(fsnav->ref);
    fsnav->ref = (fsnav_ref *)0x0;
  }
  return;
}

Assistant:

void fsnav_free_ref(void)
{
	if (fsnav->ref == NULL)
		return;

	// configuration
	fsnav->ref->cfg = NULL;
	fsnav->ref->cfglength = 0;

	// solution
	fsnav_free_sol(&(fsnav->ref->sol));
	
	// fsnav_ref structure
	free((void*)(fsnav->ref));
	fsnav->ref = NULL;
}